

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinVWN3>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps,
               host_buffer_type vxc)

{
  ulong uVar1;
  double e;
  double v;
  double local_48;
  double local_40;
  double local_38;
  
  if (0 < N) {
    uVar1 = 0;
    local_38 = scal_fact;
    do {
      if (rho[uVar1] <= 1e-24) {
        local_48 = 0.0;
        local_40 = 0.0;
      }
      else {
        kernel_traits<ExchCXX::BuiltinVWN3>::eval_exc_vxc_unpolar_impl
                  (rho[uVar1],&local_48,&local_40);
        scal_fact = local_38;
      }
      eps[uVar1] = local_48 * scal_fact + eps[uVar1];
      vxc[uVar1] = local_40 * scal_fact + vxc[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

LDA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    double v,e;
    traits::eval_exc_vxc_unpolar( rho[i], e, v );
    eps[i] += scal_fact * e;
    vxc[i] += scal_fact * v;

  }

}